

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Operator(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this,size_t t_precedence)

{
  size_t t_precedence_00;
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  eval_error *peVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Alloc_hider _Var10;
  size_t t_match_start;
  string oper;
  Depth_Counter dc;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ulong local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  Depth_Counter local_c0;
  File_Position local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Depth_Counter::Depth_Counter(&local_c0,this);
  local_e8 = (ulong)m_operators._M_elems[t_precedence];
  if (m_operators._M_elems[t_precedence] == Prefix) {
    bVar4 = Value(this);
  }
  else {
    puVar1 = (this->m_match_stack).
             super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (this->m_match_stack).
             super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    t_precedence_00 = t_precedence + 1;
    bVar4 = Operator(this,t_precedence_00);
    if (bVar4) {
      t_match_start = (long)puVar1 - (long)puVar2 >> 3;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
      iVar3 = (int)local_e8;
LAB_0032728a:
      local_128._M_dataplus._M_p = (pointer)&local_108;
      local_128._M_string_length = (size_type)this;
      bVar5 = ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
              ::Operator_Matches::
              any_of<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>::Operator_Helper(unsigned_long,std::__cxx11::string&)::_lambda(auto:1_const&)_1_>
                        ((Operator_Matches *)&m_operator_matches,t_precedence,
                         (anon_class_16_2_3fa356a9_for__M_pred *)&local_128);
      if (!bVar5) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,
                          CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                   local_108.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_003274df;
      }
      do {
        bVar5 = Eol(this);
      } while (bVar5);
      bVar5 = Operator(this,t_precedence_00);
      if (!bVar5) {
        peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
        std::operator+(&local_e0,"Incomplete \'",&local_108);
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_e0,"\' expression");
        local_128._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
        paVar9 = &pbVar8->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p == paVar9) {
          local_128.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_128.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        }
        else {
          local_128.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_128._M_string_length = pbVar8->_M_string_length;
        (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar8->_M_string_length = 0;
        (pbVar8->field_2)._M_local_buf[0] = '\0';
        local_b8.line = (this->m_position).line;
        local_b8.column = (this->m_position).col;
        exception::eval_error::eval_error
                  (peVar7,&local_128,&local_b8,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      if (iVar3 - 3U < 8) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_108._M_dataplus._M_p,
                   local_108._M_dataplus._M_p + local_108._M_string_length);
        ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
        ::
        build_match<chaiscript::eval::Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
                  ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                    *)this,t_match_start,&local_70);
        paVar9 = &local_70.field_2;
        _Var10._M_p = local_70._M_dataplus._M_p;
      }
      else {
        iVar6 = (int)local_e8;
        if (1 < iVar6) {
          if (iVar6 == 2) {
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,local_108._M_dataplus._M_p,
                       local_108._M_dataplus._M_p + local_108._M_string_length);
            ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
            ::
            build_match<chaiscript::eval::Logical_And_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
                      ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                        *)this,t_match_start,&local_90);
            paVar9 = &local_90.field_2;
            _Var10._M_p = local_90._M_dataplus._M_p;
            goto LAB_00327327;
          }
          if (iVar6 == 0xb) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_parser.hpp"
                          ,0x9cf,
                          "bool chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>, chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold, chaiscript::optimizer::Unused_Return, chaiscript::optimizer::Constant_Fold, chaiscript::optimizer::If, chaiscript::optimizer::Return, chaiscript::optimizer::Dead_Code, chaiscript::optimizer::Block, chaiscript::optimizer::For_Loop, chaiscript::optimizer::Assign_Decl>>::Operator(const size_t) [Tracer = chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>, Optimizer = chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold, chaiscript::optimizer::Unused_Return, chaiscript::optimizer::Constant_Fold, chaiscript::optimizer::If, chaiscript::optimizer::Return, chaiscript::optimizer::Dead_Code, chaiscript::optimizer::Block, chaiscript::optimizer::For_Loop, chaiscript::optimizer::Assign_Decl>, Parse_Depth = 512]"
                         );
          }
          goto LAB_0032728a;
        }
        if (iVar6 == 0) {
          local_128._M_dataplus._M_p = (pointer)0x1;
          local_128._M_string_length = 0x35ca23;
          bVar5 = Symbol(this,(Static_String *)&local_128,false);
          if (!bVar5) {
            peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
            std::operator+(&local_e0,"Incomplete \'",&local_108);
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_e0,"\' expression");
            local_128._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar9 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p == paVar9) {
              local_128.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_128.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            }
            else {
              local_128.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            }
            local_128._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            local_b8.line = (this->m_position).line;
            local_b8.column = (this->m_position).col;
            exception::eval_error::eval_error
                      (peVar7,&local_128,&local_b8,
                       (this->m_filename).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
            __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
          }
          bVar5 = Operator(this,t_precedence_00);
          if (!bVar5) {
            peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
            std::operator+(&local_e0,"Incomplete \'",&local_108);
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_e0,"\' expression");
            local_128._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar9 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p == paVar9) {
              local_128.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_128.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            }
            else {
              local_128.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            }
            local_128._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            local_b8.line = (this->m_position).line;
            local_b8.column = (this->m_position).col;
            exception::eval_error::eval_error
                      (peVar7,&local_128,&local_b8,
                       (this->m_filename).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
            __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
          ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
          ::
          build_match<chaiscript::eval::If_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
                    ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                      *)this,t_match_start,&local_50);
          paVar9 = &local_50.field_2;
          _Var10._M_p = local_50._M_dataplus._M_p;
          goto LAB_00327327;
        }
        if (iVar6 != 1) goto LAB_0032728a;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_108._M_dataplus._M_p,
                   local_108._M_dataplus._M_p + local_108._M_string_length);
        ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
        ::
        build_match<chaiscript::eval::Logical_Or_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
                  ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                    *)this,t_match_start,&local_b0);
        paVar9 = &local_b0.field_2;
        _Var10._M_p = local_b0._M_dataplus._M_p;
      }
LAB_00327327:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p != paVar9) {
        operator_delete(_Var10._M_p,paVar9->_M_allocated_capacity + 1);
      }
      goto LAB_0032728a;
    }
  }
LAB_003274df:
  (local_c0.parser)->m_current_parse_depth = (local_c0.parser)->m_current_parse_depth - 1;
  return bVar4;
}

Assistant:

bool Operator(const size_t t_precedence = 0) {
        Depth_Counter dc{this};
        bool retval = false;
        const auto prev_stack_top = m_match_stack.size();

        if (m_operators[t_precedence] != Operator_Precedence::Prefix) {
          if (Operator(t_precedence + 1)) {
            retval = true;
            std::string oper;
            while (Operator_Helper(t_precedence, oper)) {
              while (Eol()) {
              }
              if (!Operator(t_precedence + 1)) {
                throw exception::eval_error("Incomplete '" + oper + "' expression",
                                            File_Position(m_position.line, m_position.col),
                                            *m_filename);
              }

              switch (m_operators[t_precedence]) {
                case (Operator_Precedence::Ternary_Cond):
                  if (Symbol(":")) {
                    if (!Operator(t_precedence + 1)) {
                      throw exception::eval_error("Incomplete '" + oper + "' expression",
                                                  File_Position(m_position.line, m_position.col),
                                                  *m_filename);
                    }
                    build_match<eval::If_AST_Node<Tracer>>(prev_stack_top);
                  } else {
                    throw exception::eval_error("Incomplete '" + oper + "' expression",
                                                File_Position(m_position.line, m_position.col),
                                                *m_filename);
                  }
                  break;

                case (Operator_Precedence::Addition):
                case (Operator_Precedence::Multiplication):
                case (Operator_Precedence::Shift):
                case (Operator_Precedence::Equality):
                case (Operator_Precedence::Bitwise_And):
                case (Operator_Precedence::Bitwise_Xor):
                case (Operator_Precedence::Bitwise_Or):
                case (Operator_Precedence::Comparison):
                  build_match<eval::Binary_Operator_AST_Node<Tracer>>(prev_stack_top, oper);
                  break;

                case (Operator_Precedence::Logical_And):
                  build_match<eval::Logical_And_AST_Node<Tracer>>(prev_stack_top, oper);
                  break;
                case (Operator_Precedence::Logical_Or):
                  build_match<eval::Logical_Or_AST_Node<Tracer>>(prev_stack_top, oper);
                  break;
                case (Operator_Precedence::Prefix):
                  assert(false); // cannot reach here because of if() statement at the top
                  break;

                  //                default:
                  //                  throw exception::eval_error("Internal error: unhandled ast_node",
                  //                  File_Position(m_position.line, m_position.col), *m_filename);
              }
            }
          }
        } else {
          return Value();
        }

        return retval;
      }